

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O1

void __thiscall Assimp::XFileParser::ParseDataObjectMeshTextureCoords(XFileParser *this,Mesh *pMesh)

{
  uint uVar1;
  aiVector2t<float> aVar2;
  uint uVar3;
  ulong uVar4;
  ulong __new_size;
  ai_real aVar5;
  undefined4 extraout_XMM0_Db;
  string local_58;
  float local_38;
  float fStack_34;
  undefined4 uStack_30;
  
  readHeadOfDataObject(this,(string *)0x0);
  uVar1 = pMesh->mNumTextures;
  uVar3 = uVar1 + 1;
  if (8 < uVar3) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Too many sets of texture coordinates","");
    ThrowException(this,&local_58);
  }
  pMesh->mNumTextures = uVar3;
  uVar3 = ReadInt(this);
  __new_size = (ulong)uVar3;
  if (((long)(pMesh->mPositions).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(pMesh->mPositions).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 - __new_size == 0) {
    std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize
              (pMesh->mTexCoords + uVar1,__new_size);
    if (__new_size != 0) {
      uVar4 = 0;
      do {
        local_38 = ReadFloat(this);
        fStack_34 = (float)extraout_XMM0_Db;
        aVar5 = ReadFloat(this);
        uStack_30 = fStack_34;
        fStack_34 = aVar5;
        TestForSeparator(this);
        aVar2.y = fStack_34;
        aVar2.x = local_38;
        pMesh->mTexCoords[uVar1].
        super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start[uVar4] = aVar2;
        uVar4 = uVar4 + 1;
      } while (__new_size != uVar4);
    }
    CheckForClosingBrace(this);
    return;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Texture coord count does not match vertex count","");
  ThrowException(this,&local_58);
}

Assistant:

void XFileParser::ParseDataObjectMeshTextureCoords( Mesh* pMesh)
{
    readHeadOfDataObject();
    if( pMesh->mNumTextures + 1 > AI_MAX_NUMBER_OF_TEXTURECOORDS)
        ThrowException( "Too many sets of texture coordinates");

    std::vector<aiVector2D>& coords = pMesh->mTexCoords[pMesh->mNumTextures++];

    unsigned int numCoords = ReadInt();
    if( numCoords != pMesh->mPositions.size())
        ThrowException( "Texture coord count does not match vertex count");

    coords.resize( numCoords);
    for( unsigned int a = 0; a < numCoords; a++)
        coords[a] = ReadVector2();

    CheckForClosingBrace();
}